

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_transfer.cpp
# Opt level: O2

void Omega_h::transfer_common3<double>
               (Mesh *new_mesh,Int ent_dim,TagBase *tagbase,Write<double> *new_data)

{
  Int ncomps;
  string *name;
  Write<double> local_50;
  Write<double> local_40;
  
  name = TagBase::name_abi_cxx11_(tagbase);
  ncomps = TagBase::ncomps(tagbase);
  Write<double>::Write(&local_40,new_data);
  Read<double>::Read((Read<signed_char> *)&local_50,&local_40);
  Mesh::add_tag<double>(new_mesh,ent_dim,name,ncomps,(Read<double> *)&local_50,true);
  Write<double>::~Write(&local_50);
  Write<double>::~Write(&local_40);
  return;
}

Assistant:

void transfer_common3(
    Mesh* new_mesh, Int ent_dim, TagBase const* tagbase, Write<T> new_data) {
  auto const& name = tagbase->name();
  auto ncomps = tagbase->ncomps();
  new_mesh->add_tag(ent_dim, name, ncomps, Read<T>(new_data), true);
}